

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBasisToolsBspline.h
# Opt level: O1

void chrono::geometry::ChBasisToolsBspline::BasisEvaluateDeriv
               (int p,int i,double u,ChVectorDynamic<> *knotU,ChMatrixDynamic<> *DN)

{
  long lVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  double *pdVar6;
  void *pvVar7;
  undefined8 *puVar8;
  uint uVar9;
  uint uVar10;
  double *pdVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  double *pdVar24;
  double *pdVar25;
  ulong uVar26;
  undefined1 auVar27 [64];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ChMatrixDynamic<> ndu;
  ChMatrixDynamic<> a;
  uint local_154;
  DenseStorage<double,__1,__1,__1,_1> local_e8;
  long local_d0;
  double *local_c8;
  long local_c0;
  ulong local_b8;
  double *local_b0;
  long local_a8;
  ulong local_a0;
  DenseStorage<double,__1,__1,__1,_1> local_98;
  double *local_78;
  ulong local_70;
  double *local_68;
  double *local_60;
  ulong local_58;
  double *local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  uVar5 = (uint)(DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                m_rows;
  lVar22 = (long)p;
  uVar19 = 0xffffffffffffffff;
  if (-2 < p) {
    uVar19 = lVar22 * 8 + 8;
  }
  pdVar6 = (double *)operator_new__(uVar19);
  pvVar7 = operator_new__(uVar19);
  local_e8.m_data = (double *)0x0;
  local_e8.m_rows = 0;
  local_e8.m_cols = 0;
  if (p < -1) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  lVar20 = lVar22 + 1;
  if (((int)lVar20 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar20),0) < lVar20)) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = std::ostream::_M_insert<bool>;
    __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_e8,lVar20 * lVar20,lVar20,lVar20);
  local_98.m_data = (double *)0x0;
  local_98.m_rows = 0;
  local_98.m_cols = 0;
  if (((int)lVar20 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar20),0) < lVar20)) {
    puVar8 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar8 = std::ostream::_M_insert<bool>;
    __cxa_throw(puVar8,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_98,lVar20 * lVar20,lVar20,lVar20);
  if ((0 < local_e8.m_rows) && (0 < local_e8.m_cols)) {
    uVar19 = local_e8.m_cols;
    if (local_e8.m_rows < local_e8.m_cols) {
      uVar19 = local_e8.m_rows;
    }
    *local_e8.m_data = 1.0;
    if (0 < p) {
      pdVar17 = (knotU->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      lVar20 = (knotU->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows;
      uVar26 = 1;
      pdVar16 = local_e8.m_data;
      pdVar18 = pdVar6;
      pdVar11 = local_e8.m_data;
      do {
        pdVar11 = pdVar11 + local_e8.m_cols;
        pdVar18 = pdVar18 + 1;
        pdVar16 = pdVar16 + 1;
        iVar12 = (i + 1) - (int)uVar26;
        if ((iVar12 < 0) || (lVar20 <= iVar12)) {
LAB_006a3d41:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        pdVar6[uVar26] = u - pdVar17[iVar12];
        lVar23 = uVar26 + (long)i;
        if ((lVar23 < 0) || (lVar20 <= lVar23)) goto LAB_006a3d41;
        *(double *)((long)pvVar7 + uVar26 * 8) = pdVar17[lVar23] - u;
        if (local_e8.m_rows <= (long)uVar26) goto LAB_006a3d22;
        auVar27 = ZEXT1664(ZEXT816(0));
        uVar13 = 0;
        pdVar24 = pdVar16;
        pdVar25 = pdVar18;
        do {
          if (local_e8.m_cols == uVar13) goto LAB_006a3d22;
          dVar28 = *pdVar25 + *(double *)((long)pvVar7 + uVar13 * 8 + 8);
          pdVar11[uVar13] = dVar28;
          if ((local_e8.m_rows == uVar13) || (local_e8.m_cols <= (long)uVar26)) goto LAB_006a3d22;
          auVar29._0_8_ = pdVar24[-1] / dVar28;
          auVar29._8_8_ = 0;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)((long)pvVar7 + uVar13 * 8 + 8);
          auVar30 = vfmadd231sd_fma(auVar27._0_16_,auVar29,auVar30);
          uVar13 = uVar13 + 1;
          *pdVar24 = auVar30._0_8_;
          dVar28 = *pdVar25;
          auVar27 = ZEXT864((ulong)(auVar29._0_8_ * dVar28));
          pdVar25 = pdVar25 + -1;
          pdVar24 = pdVar24 + local_e8.m_cols;
        } while (uVar26 != uVar13);
        if (uVar26 == uVar19) goto LAB_006a3d22;
        local_e8.m_data[local_e8.m_cols * uVar26 + uVar26] = auVar29._0_8_ * dVar28;
        uVar26 = uVar26 + 1;
      } while (uVar26 != p + 1);
    }
    if (-1 < p) {
      if (local_e8.m_cols <= (long)(ulong)(uint)p) goto LAB_006a3d22;
      pdVar16 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                m_data;
      lVar20 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
               m_rows;
      pdVar17 = local_e8.m_data + (uint)p;
      uVar19 = 0;
      do {
        if (((local_e8.m_rows == uVar19) || (lVar20 < 1)) ||
           ((DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols
            <= (long)uVar19)) goto LAB_006a3d22;
        pdVar16[uVar19] = *pdVar17;
        uVar19 = uVar19 + 1;
        pdVar17 = pdVar17 + local_e8.m_cols;
      } while (p + 1 != uVar19);
    }
    if (uVar5 != 1) {
      uVar9 = 1;
      if (1 < (int)uVar5) {
        uVar9 = uVar5;
      }
      iVar12 = -1;
      if (-1 < p) {
        iVar12 = p;
      }
      local_70 = (ulong)(iVar12 + 1U);
      local_b8 = (ulong)uVar9;
      if (iVar12 + 1U != 0) {
        local_c8 = local_e8.m_data + local_e8.m_cols * lVar22;
        local_58 = local_e8.m_cols * 8 ^ 0xfffffffffffffff8;
        local_78 = local_e8.m_data + lVar22 + -1;
        local_d0 = -1;
        uVar19 = 0;
        do {
          if (local_98.m_rows < 1 || local_98.m_cols < 1) goto LAB_006a3d22;
          *local_98.m_data = 1.0;
          if (1 < (int)uVar5) {
            local_38 = uVar19 - 1;
            local_60 = local_e8.m_data + uVar19;
            local_68 = local_e8.m_data + local_e8.m_cols * uVar19;
            local_50 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                       m_storage.m_data + uVar19;
            local_48 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                       m_storage.m_rows;
            local_c0 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                       m_storage.m_cols;
            local_154 = 0;
            local_a8 = local_d0;
            uVar26 = uVar19;
            pdVar17 = local_c8;
            uVar13 = 1;
            uVar9 = 1;
            local_b0 = local_78;
            do {
              uVar10 = uVar9;
              uVar21 = uVar13;
              lVar20 = lVar22 - uVar21;
              uVar13 = uVar19 - uVar21;
              auVar27 = ZEXT864(0) << 0x40;
              local_40 = uVar19;
              if (uVar21 <= uVar19) {
                if (((local_98.m_rows <= (long)(ulong)local_154) || (lVar20 < -1)) ||
                   (((ulong)local_e8.m_cols <= uVar13 ||
                    ((local_e8.m_rows <= lVar20 + 1 || (local_98.m_rows <= (long)(ulong)uVar10))))))
                goto LAB_006a3d22;
                dVar28 = local_98.m_data[(ulong)local_154 * local_98.m_cols];
                dVar2 = local_e8.m_data[(lVar20 + 1) * local_e8.m_cols + uVar13];
                local_98.m_data[(ulong)uVar10 * local_98.m_cols] = dVar28 / dVar2;
                if ((local_e8.m_cols <= lVar20) ||
                   ((lVar20 == -1 || (local_e8.m_rows <= (long)uVar13)))) goto LAB_006a3d22;
                auVar27 = ZEXT864((ulong)((dVar28 / dVar2) *
                                         local_e8.m_data[local_e8.m_cols * uVar13 + lVar20]));
              }
              auVar30 = auVar27._0_16_;
              iVar12 = -(int)uVar13;
              if (-2 < (long)uVar13) {
                iVar12 = 1;
              }
              iVar15 = (int)uVar21 + -1;
              if (lVar20 < local_38) {
                iVar15 = p - (int)uVar19;
              }
              local_a0 = uVar21;
              if (iVar12 <= iVar15) {
                if (local_98.m_rows <= (long)(ulong)local_154) goto LAB_006a3d22;
                lVar14 = (ulong)local_154 * local_98.m_cols;
                pdVar16 = (double *)((local_a8 + iVar12) * local_e8.m_cols * 8 + (long)local_b0);
                lVar23 = (long)iVar12 + -1;
                do {
                  if (((((iVar12 < 0) || (lVar1 = lVar23 + 1, local_98.m_cols <= lVar1)) ||
                       (iVar12 < 1)) || ((lVar20 < -1 || (local_e8.m_rows <= lVar20 + 1)))) ||
                     (((ulong)local_e8.m_cols <= uVar26 + lVar23 ||
                      (local_98.m_rows <= (long)(ulong)uVar10)))) goto LAB_006a3d22;
                  auVar31._0_8_ =
                       (local_98.m_data[lVar14 + lVar23 + 1] - local_98.m_data[lVar14 + lVar23]) /
                       pdVar17[lVar23];
                  auVar31._8_8_ = 0;
                  local_98.m_data[local_98.m_cols * (ulong)uVar10 + lVar23 + 1] = auVar31._0_8_;
                  if (((local_e8.m_cols <= lVar20) || (lVar20 == -1)) ||
                     (local_e8.m_rows <= (long)(uVar26 + lVar23))) goto LAB_006a3d22;
                  auVar3._8_8_ = 0;
                  auVar3._0_8_ = *pdVar16;
                  auVar30 = vfmadd231sd_fma(auVar27._0_16_,auVar31,auVar3);
                  auVar27 = ZEXT1664(auVar30);
                  pdVar16 = pdVar16 + local_e8.m_cols;
                  lVar23 = lVar1;
                } while (lVar1 < iVar15);
              }
              dVar28 = auVar30._0_8_;
              if ((long)uVar19 <= lVar20) {
                if (((((local_98.m_rows <= (long)(ulong)local_154) ||
                      (local_98.m_cols < (long)uVar21)) || (local_e8.m_rows <= lVar20 + 1)) ||
                    ((local_e8.m_cols <= (long)uVar19 || (local_98.m_rows <= (long)(ulong)uVar10))))
                   || (local_98.m_cols <= (long)uVar21)) goto LAB_006a3d22;
                auVar32._0_8_ =
                     -local_98.m_data[(ulong)local_154 * local_98.m_cols + (uVar21 - 1)] /
                     local_60[(lVar20 + 1) * local_e8.m_cols];
                auVar32._8_8_ = 0x8000000000000000;
                local_98.m_data[(ulong)uVar10 * local_98.m_cols + uVar21] = auVar32._0_8_;
                if ((local_e8.m_rows <= (long)uVar19) || (local_e8.m_cols <= lVar20))
                goto LAB_006a3d22;
                auVar4._8_8_ = 0;
                auVar4._0_8_ = local_68[lVar20];
                auVar30 = vfmadd231sd_fma(auVar30,auVar32,auVar4);
                dVar28 = auVar30._0_8_;
              }
              if ((local_48 <= (long)uVar21) || (local_c0 <= (long)uVar19)) goto LAB_006a3d22;
              local_50[local_c0 * uVar21] = dVar28;
              uVar26 = uVar26 - 1;
              pdVar17 = (double *)((long)pdVar17 + local_58);
              local_b0 = local_b0 + -1;
              local_a8 = local_a8 + -1;
              uVar13 = uVar21 + 1;
              uVar9 = local_154;
              local_154 = uVar10;
            } while (uVar21 + 1 != local_b8);
          }
          uVar19 = uVar19 + 1;
          local_c8 = local_c8 + 1;
          local_d0 = local_d0 + 1;
        } while (uVar19 != local_70);
      }
      if (1 < (int)uVar5) {
        lVar22 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                 m_rows;
        uVar19 = 1;
        lVar20 = 8;
        iVar12 = p;
        do {
          if (-1 < p) {
            if (lVar22 <= (long)uVar19) goto LAB_006a3d22;
            uVar26 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                     m_storage.m_cols;
            pdVar17 = (DN->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).
                      m_storage.m_data;
            uVar13 = 0;
            do {
              if ((~((long)uVar26 >> 0x3f) & uVar26) == uVar13) goto LAB_006a3d22;
              *(double *)((long)pdVar17 + uVar13 * 8 + uVar26 * lVar20) =
                   (double)iVar12 * *(double *)((long)pdVar17 + uVar13 * 8 + uVar26 * lVar20);
              uVar13 = uVar13 + 1;
            } while (p + 1 != uVar13);
          }
          iVar12 = iVar12 * (p - (int)uVar19);
          uVar19 = uVar19 + 1;
          lVar20 = lVar20 + 8;
        } while (uVar19 != local_b8);
      }
      operator_delete__(pdVar6);
      operator_delete__(pvVar7);
    }
    if (local_98.m_data != (double *)0x0) {
      free((void *)local_98.m_data[-1]);
    }
    if (local_e8.m_data != (double *)0x0) {
      free((void *)local_e8.m_data[-1]);
    }
    return;
  }
LAB_006a3d22:
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

static void BasisEvaluateDeriv(const int p,     ///< order of spline
                                   const int i,     ///< knot span, assume aready computed via FindSpan()
                                   const double u,  ///< parameter
                                   const ChVectorDynamic<>& knotU,  ///< knot vector
                                   ChMatrixDynamic<>& DN  ///< here return derivatives evaluated at u, that is: dN/du(u)
    ) {
        int order = (int)DN.rows() - 1;  // max order of derivatives (0th in row 0 of DN, 1st in row 1 of DN, etc.)
        double saved, temp;
        int j, k, j1, j2, r;

        double* left = new double[p + 1];
        double* right = new double[p + 1];

        ChMatrixDynamic<> ndu(p + 1, p + 1);
        ChMatrixDynamic<> a(p + 1, p + 1);

        ndu(0, 0) = 1.;
        for (j = 1; j <= p; j++) {
            left[j] = u - knotU(i + 1 - j);
            right[j] = knotU(i + j) - u;
            saved = 0.0;
            for (r = 0; r < j; r++) {
                ndu(j, r) = right[r + 1] + left[j - r];
                temp = ndu(r, j - 1) / ndu(j, r);

                ndu(r, j) = saved + right[r + 1] * temp;
                saved = left[j - r] * temp;
            }
            ndu(j, j) = saved;
        }
        for (j = 0; j <= p; j++)
            DN(0, j) = ndu(j, p);

        if (order == 0)
            return;

        for (r = 0; r <= p; r++) {
            int s1 = 0, s2 = 1;
            a(0, 0) = 1.0;

            for (k = 1; k <= order; k++) {
                double d = 0.;
                int rk = r - k, pk = p - k;
                if (r >= k) {
                    a(s2, 0) = a(s1, 0) / ndu(pk + 1, rk);
                    d = a(s2, 0) * ndu(rk, pk);
                }
                j1 = rk >= -1 ? 1 : -rk;
                j2 = (r - 1 <= pk) ? k - 1 : p - r;
                for (j = j1; j <= j2; j++) {
                    a(s2, j) = (a(s1, j) - a(s1, j - 1)) / ndu(pk + 1, rk + j);
                    d += a(s2, j) * ndu(rk + j, pk);
                }
                if (r <= pk) {
                    a(s2, k) = -a(s1, k - 1) / ndu(pk + 1, r);
                    d += a(s2, k) * ndu(r, pk);
                }
                DN(k, r) = d;
                j = s1;
                s1 = s2;
                s2 = j;
            }
        }
        r = p;
        for (k = 1; k <= order; k++) {
            for (j = 0; j <= p; j++)
                DN(k, j) *= r;
            r *= (p - k);
        }

        delete[] left;
        delete[] right;
    }